

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceULT.cpp
# Opt level: O1

void __thiscall
CTestResource_Test2DTileYResourceArrays_Test::TestBody
          (CTestResource_Test2DTileYResourceArrays_Test *this)

{
  int iVar1;
  CTestResource_Test2DTileYResourceArrays_Test *this_00;
  undefined4 uVar2;
  GMM_RESOURCE_INFO *ResourceInfo;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  uint ExpectedValue;
  long lVar6;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  ulong local_98;
  undefined8 uStack_90;
  undefined4 local_88;
  int iStack_84;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  long local_48;
  CTestResource_Test2DTileYResourceArrays_Test *local_40;
  uint local_34;
  
  local_68 = 0;
  uStack_b0 = 0;
  uStack_80 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_78 = 0;
  uStack_70 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_c8 = 2;
  uStack_60 = 0x100000000;
  uStack_c0 = 0x400000000;
  local_b8 = 0x1000000000;
  local_88 = 0;
  iStack_84 = 4;
  lVar6 = 0;
  local_34 = 0;
  local_40 = this;
  do {
    iVar1 = iStack_84;
    uVar2 = 0;
    if (local_34 < 5) {
      uVar2 = *(undefined4 *)((long)&DAT_001ad6d0 + lVar6);
    }
    local_c8 = CONCAT44(uVar2,(undefined4)local_c8);
    iVar5 = 0;
    uVar3 = 0;
    if (local_34 < 5) {
      uVar3 = (ulong)*(uint *)((long)&DAT_001ad674 + lVar6);
    }
    local_98 = (ulong)((int)(0x80 / uVar3) + 1);
    uStack_90 = CONCAT44(uStack_90._4_4_,0x21);
    ResourceInfo = (GMM_RESOURCE_INFO *)
                   (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                             (CommonULT::pGmmULTClientContext,&local_c8,0x80 % uVar3);
    this_00 = local_40;
    if (local_34 < 5) {
      iVar5 = *(int *)((long)&DAT_001ad674 + lVar6);
    }
    uVar4 = ((int)local_98 + 0xfU & 0xfffffff0) * iVar5 + 0x7f;
    ExpectedValue = uVar4 & 0xffffff80;
    local_48 = lVar6;
    CTestResource::VerifyResourceHAlign<true>(&local_40->super_CTestResource,ResourceInfo,0x10);
    CTestResource::VerifyResourceVAlign<true>(&this_00->super_CTestResource,ResourceInfo,4);
    CTestResource::VerifyResourcePitch<true>
              (&this_00->super_CTestResource,ResourceInfo,ExpectedValue);
    CTestResource::VerifyResourcePitchInTiles<true>
              (&this_00->super_CTestResource,ResourceInfo,uVar4 >> 7);
    CTestResource::VerifyResourceSize<true>
              (&this_00->super_CTestResource,ResourceInfo,
               (ulong)(ExpectedValue * ((iVar1 * -0x24 & 0x1cU) + iVar1 * 0x24)));
    lVar6 = local_48;
    CTestResource::VerifyResourceQPitch<true>(&this_00->super_CTestResource,ResourceInfo,0x24);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,ResourceInfo);
    local_34 = local_34 + 1;
    lVar6 = lVar6 + 4;
  } while (local_34 != 5);
  return;
}

Assistant:

TEST_F(CTestResource, Test2DTileYResourceArrays)
{
    // Horizontal/Vertical pixel alignment
    const uint32_t HAlign = 16;
    const uint32_t VAlign = 4;

    const uint32_t TileWidth  = 128;
    const uint32_t TileHeight = 32;

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_2D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Info.TiledY    = 1;
    gmmParams.Flags.Gpu.Texture    = 1;
    gmmParams.ArraySize            = 4;

    // Allocate 2 tiles in X/Y dimension
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = (TileWidth / GetBppValue(bpp)) + 1; // 1 pixel larger than 1 tile width
        gmmParams.BaseHeight  = TileHeight + 1;                     // 1 row larger than 1 tile height
        uint32_t AlignedHeight, BlockHeight;

        BlockHeight   = GMM_ULT_ALIGN(gmmParams.BaseHeight, VAlign);
        AlignedHeight = GMM_ULT_ALIGN_NP2(BlockHeight * gmmParams.ArraySize, TileHeight);

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        const uint32_t AlignedWidth = GMM_ULT_ALIGN(gmmParams.BaseWidth64, HAlign);
        uint32_t       PitchInBytes = AlignedWidth * GetBppValue(bpp);
        PitchInBytes                = GMM_ULT_ALIGN(PitchInBytes, TileWidth);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign);
        VerifyResourcePitch<true>(ResourceInfo, PitchInBytes);
        VerifyResourcePitchInTiles<true>(ResourceInfo, PitchInBytes / TileWidth);
        VerifyResourceSize<true>(ResourceInfo, PitchInBytes * AlignedHeight); // 4 tile big x 4 array size
        VerifyResourceQPitch<true>(ResourceInfo, BlockHeight);

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}